

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

ostream * pstd::operator<<(ostream *os,optional<const_pbrt::RGBColorSpace_*> *opt)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  bVar1 = opt->set;
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ pstd::optional<",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(os,"PKN4pbrt13RGBColorSpaceE",0x18);
  if (bVar1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"> set: true ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(os,"value: ",7);
    if (opt->set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xef,"Check failed: %s",(char (*) [4])0x2813e7c);
    }
    os = std::ostream::_M_insert<void_const*>(os);
    pcVar3 = " ]";
    lVar2 = 2;
  }
  else {
    pcVar3 = "> set: false value: n/a ]";
    lVar2 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}